

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.cpp
# Opt level: O1

int __thiscall
CRegexParser::break_loops
          (CRegexParser *this,re_state_id init,re_state_id final,regex_scan_frame *stack)

{
  re_recog_type rVar1;
  re_tuple_conflict *prVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  regex_scan_frame *prVar6;
  ulong uVar7;
  uint unaff_R15D;
  regex_scan_frame fr;
  regex_scan_frame local_40;
  
  local_40.parent = stack;
  do {
    if (init == final) {
      return 0;
    }
    prVar2 = this->tuple_arr_;
    rVar1 = prVar2[init].typ;
    local_40.st = init;
    switch(rVar1) {
    case RE_EPSILON:
      if (prVar2[init].next_state_2 == -1) {
        bVar3 = false;
        if (RE_ZERO_VAR < rVar1) goto switchD_002b66ee_caseD_5;
        uVar7 = (ulong)rVar1;
        if ((0x8000067c0U >> (uVar7 & 0x3f) & 1) != 0) goto switchD_002b66ee_caseD_6;
        if ((0x780000000U >> (uVar7 & 0x3f) & 1) != 0) goto switchD_002b66ee_caseD_1f;
        uVar5 = 0;
        if ((0x60010UL >> (uVar7 & 0x3f) & 1) != 0) goto switchD_002b66ee_caseD_11;
      }
      else {
        prVar6 = &local_40;
        do {
          prVar6 = prVar6->parent;
          if (prVar6 == (regex_scan_frame *)0x0) goto LAB_002b674d;
        } while (prVar6->st != init);
        if (prVar6 == (regex_scan_frame *)0x0) {
LAB_002b674d:
          iVar4 = break_loops(this,prVar2[init].next_state_2,final,&local_40);
          if (iVar4 != 0) {
            prVar2[init].next_state_2 = -1;
          }
          iVar4 = break_loops(this,prVar2[init].next_state_1,final,&local_40);
          if (iVar4 != 0) {
            prVar2[init].next_state_1 = prVar2[init].next_state_2;
            prVar2[init].next_state_2 = -1;
          }
          uVar5 = (uint)(prVar2[init].next_state_1 == -1);
        }
        else {
          uVar5 = 1;
        }
        bVar3 = false;
      }
      break;
    default:
switchD_002b66ee_caseD_5:
      bVar3 = false;
      uVar5 = 0;
      break;
    case RE_GROUP_ENTER:
    case RE_GROUP_EXIT:
switchD_002b66ee_caseD_11:
      init = prVar2[init].next_state_1;
      if (init == -1) {
        init = -1;
        goto switchD_002b66ee_caseD_5;
      }
      goto LAB_002b6712;
    case RE_ASSERT_POS:
    case RE_ASSERT_NEG:
    case RE_ASSERT_BACKPOS:
    case RE_ASSERT_BACKNEG:
switchD_002b66ee_caseD_1f:
      iVar4 = break_loops(this,prVar2[init].info.sub.init,prVar2[init].info.sub.final,
                          (regex_scan_frame *)0x0);
      if (iVar4 != 0) {
        prVar2[init].info.ch = prVar2[init].info.sub.final;
      }
    case RE_TEXT_BEGIN:
    case RE_TEXT_END:
    case RE_LOOKBACK_POS:
    case RE_WORD_BEGIN:
    case RE_WORD_END:
    case RE_WORD_BOUNDARY:
    case RE_NON_WORD_BOUNDARY:
    case RE_ZERO_VAR:
switchD_002b66ee_caseD_6:
      init = prVar2[init].next_state_1;
LAB_002b6712:
      bVar3 = true;
      uVar5 = unaff_R15D;
    }
    unaff_R15D = uVar5;
    if (!bVar3) {
      return unaff_R15D;
    }
  } while( true );
}

Assistant:

int CRegexParser::break_loops(re_state_id init, re_state_id final,
                              regex_scan_frame *stack)
{
    /* set up the scan frame for this level */
    regex_scan_frame fr(stack);
        
    /* scan the chain of states from the current state */
    for (re_state_id cur_state = init ; ; )
    {
        /* if this is the final state, we're done */
        if (cur_state == final)
            return FALSE;

        /* get the tuple for this state */
        re_tuple *tuple = &tuple_arr_[cur_state];

        /* set the current state in the recursion frame */
        fr.st = cur_state;

        /* if it's a two-transition epsilon state, recurse */
        if (tuple->typ == RE_EPSILON
            && tuple->next_state_2 != RE_STATE_INVALID)
        {
            /* 
             *   This is a branching state, so we need to recursively break
             *   loops in each branch.  If we're looping on the current
             *   state, tell the caller that this whole branch is a loop.
             */
            if (fr.is_recursing())
                return TRUE;

            /* try breaking loops in the first branch */
            if (break_loops(tuple->next_state_2, final, &fr))
            {
                /* the second branch loops - skip it */
                tuple->next_state_2 = RE_STATE_INVALID;
            }
            
            /* check the other branch */
            if (break_loops(tuple->next_state_1, final, &fr))
            {
                /* 
                 *   the first branch loops - move the second branch to
                 *   the first slot, and clear the second slot (if we only
                 *   have one branch, it must always be in the first slot) 
                 */
                tuple->next_state_1 = tuple->next_state_2;
                tuple->next_state_2 = RE_STATE_INVALID;
            }

            /* 
             *   If both branches loop, this entire state is a loop, so tell
             *   the caller to break its branch to here.  Otherwise, we've
             *   finished with the rest of this chain.  
             */
            return (tuple->next_state_1 == RE_STATE_INVALID);
        }

        /* see what kind of transition this is */
        switch(tuple->typ)
        {
        case RE_EPSILON:
        case RE_GROUP_ENTER:
        case RE_GROUP_EXIT:
            /* 
             *   epsilon or group transition - this could definitely be part
             *   of a loop, so move on to the next state and keep looking 
             */
            cur_state = tuple->next_state_1;

            /* 
             *   if this took us to an invalid state, we must have reached
             *   the final state of a sub-machine - we can go no further
             *   from here, so there are no loops in this branch 
             */
            if (cur_state == RE_STATE_INVALID)
                return FALSE;
            break;

        case RE_TEXT_BEGIN:
        case RE_TEXT_END:
        case RE_LOOKBACK_POS:
        case RE_WORD_BEGIN:
        case RE_WORD_END:
        case RE_WORD_BOUNDARY:
        case RE_NON_WORD_BOUNDARY:
        case RE_ZERO_VAR:
            /* 
             *   none of these transitions consumes input, so any of these
             *   could result in an infinite loop - continue down the
             *   current path 
             */
            cur_state = tuple->next_state_1;
            break;

        case RE_ASSERT_POS:
        case RE_ASSERT_NEG:
        case RE_ASSERT_BACKPOS:
        case RE_ASSERT_BACKNEG:
            /*
             *   Assertions have sub-machines that are independent of the
             *   main machine - there are no state transitions between the
             *   main machine and a sub-machine.  Break loops in the
             *   sub-machine recursively.  Note that this is a whole new loop
             *   break test - we don't share the stack with the enclosing
             *   machine.  
             */
            if (break_loops(tuple->info.sub.init, tuple->info.sub.final, 0))
            {
                /* 
                 *   The whole sub-machine was a loop, which makes it an
                 *   automatic zero-length match - jump immediately to its
                 *   final state on evaluation.  
                 */
                tuple->info.sub.init = tuple->info.sub.final;
            }

            /* assertions don't consume input, so continue on this path */
            cur_state = tuple->next_state_1;
            break;

        default:
            /* 
             *   all other states consume input, so this branch definitely
             *   can't loop back to the original state without consuming
             *   input - we do not need to proceed any further down the
             *   current branch, since it's not an infinite epsilon loop
             *   even if it does ultimately find its way back to the
             *   initial state 
             */
            return FALSE;
        }
    }
}